

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

CompatibleInterfaces * __thiscall cmTarget::GetCompatibleInterfaces(cmTarget *this,string *config)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  cmTarget *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  CompatibleInterfaces *pCVar3;
  pointer pbVar4;
  _Alloc_hider _Var5;
  mapped_type *this_02;
  char *pcVar6;
  size_t sVar7;
  pointer pbVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  mapped_type *local_68;
  pointer local_60;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_58;
  vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_> *local_50;
  const_iterator local_48;
  const_iterator local_40;
  const_iterator local_38;
  
  this_02 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::CompatibleInterfaces,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::CompatibleInterfaces>_>_>
            ::operator[](&((this->Internal).Pointer)->CompatibleInterfacesMap,config);
  local_68 = this_02;
  if (this_02->Done == false) {
    this_02->Done = true;
    paVar10 = &local_a8.field_2;
    local_a8._M_dataplus._M_p = (pointer)paVar10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"POSITION_INDEPENDENT_CODE","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)this_02,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar10) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    local_a8._M_dataplus._M_p = (pointer)paVar10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"AUTOUIC_OPTIONS","");
    local_58 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&(this_02->super_CompatibleInterfaces).PropsString;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>(local_58,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar10) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    local_50 = GetLinkImplementationClosure(this,config);
    local_60 = (local_50->super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    if (local_60 !=
        (local_50->super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      local_38._M_node =
           &(local_68->super_CompatibleInterfaces).PropsBool._M_t._M_impl.super__Rb_tree_header.
            _M_header;
      local_40._M_node =
           &(local_68->super_CompatibleInterfaces).PropsString._M_t._M_impl.super__Rb_tree_header.
            _M_header;
      this_01 = &(local_68->super_CompatibleInterfaces).PropsNumberMin;
      local_48._M_node =
           &(local_68->super_CompatibleInterfaces).PropsNumberMin._M_t._M_impl.super__Rb_tree_header
            ._M_header;
      this_00 = &(local_68->super_CompatibleInterfaces).PropsNumberMax;
      pCVar3 = &local_68->super_CompatibleInterfaces;
      do {
        paVar10 = &local_a8.field_2;
        pcVar1 = *local_60;
        local_a8._M_dataplus._M_p = (pointer)paVar10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"COMPATIBLE_INTERFACE_BOOL","");
        pcVar6 = GetProperty(pcVar1,&local_a8,pcVar1->Makefile);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar10) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if (pcVar6 != (char *)0x0) {
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_a8._M_dataplus._M_p = (pointer)paVar10;
          sVar7 = strlen(pcVar6);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,pcVar6,pcVar6 + sVar7)
          ;
          cmSystemTools::ExpandListArgument(&local_a8,&local_88,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != paVar10) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          pbVar4 = local_88.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_a8._M_dataplus._M_p = (pointer)local_68;
          for (pbVar8 = local_88.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar4;
              pbVar8 = pbVar8 + 1) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::
            _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)local_68,local_38,pbVar8,(_Alloc_node *)&local_a8);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_88);
        }
        paVar10 = &local_a8.field_2;
        pcVar1 = *local_60;
        local_a8._M_dataplus._M_p = (pointer)paVar10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"COMPATIBLE_INTERFACE_STRING","");
        pcVar6 = GetProperty(pcVar1,&local_a8,pcVar1->Makefile);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar10) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if (pcVar6 != (char *)0x0) {
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_a8._M_dataplus._M_p = (pointer)paVar10;
          sVar7 = strlen(pcVar6);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,pcVar6,pcVar6 + sVar7)
          ;
          cmSystemTools::ExpandListArgument(&local_a8,&local_88,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != paVar10) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          pbVar4 = local_88.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_a8._M_dataplus._M_p = (pointer)local_58;
          for (pbVar8 = local_88.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar4;
              pbVar8 = pbVar8 + 1) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::
            _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                      (local_58,local_40,pbVar8,(_Alloc_node *)&local_a8);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_88);
        }
        paVar10 = &local_a8.field_2;
        pcVar1 = *local_60;
        local_a8._M_dataplus._M_p = (pointer)paVar10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"COMPATIBLE_INTERFACE_NUMBER_MIN","");
        pcVar6 = GetProperty(pcVar1,&local_a8,pcVar1->Makefile);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar10) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if (pcVar6 != (char *)0x0) {
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_a8._M_dataplus._M_p = (pointer)paVar10;
          sVar7 = strlen(pcVar6);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,pcVar6,pcVar6 + sVar7)
          ;
          cmSystemTools::ExpandListArgument(&local_a8,&local_88,false);
          pbVar9 = local_88.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          _Var5._M_p = (pointer)this_01;
          pbVar2 = local_88.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != paVar10) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            pbVar9 = local_88.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pbVar2 = local_88.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          for (; local_a8._M_dataplus._M_p = _Var5._M_p, pbVar9 != pbVar2; pbVar9 = pbVar9 + 1) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::
            _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)this_01,local_48,pbVar9,(_Alloc_node *)&local_a8);
            _Var5._M_p = local_a8._M_dataplus._M_p;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_88);
        }
        paVar10 = &local_a8.field_2;
        pcVar1 = *local_60;
        local_a8._M_dataplus._M_p = (pointer)paVar10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"COMPATIBLE_INTERFACE_NUMBER_MAX","");
        pcVar6 = GetProperty(pcVar1,&local_a8,pcVar1->Makefile);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar10) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if (pcVar6 != (char *)0x0) {
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_a8._M_dataplus._M_p = (pointer)paVar10;
          sVar7 = strlen(pcVar6);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,pcVar6,pcVar6 + sVar7)
          ;
          cmSystemTools::ExpandListArgument(&local_a8,&local_88,false);
          pbVar9 = local_88.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          _Var5._M_p = (pointer)this_00;
          pbVar2 = local_88.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != paVar10) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            pbVar9 = local_88.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pbVar2 = local_88.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          for (; local_a8._M_dataplus._M_p = _Var5._M_p, pbVar9 != pbVar2; pbVar9 = pbVar9 + 1) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::
            _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)this_00,
                       (const_iterator)&(pCVar3->PropsNumberMax)._M_t._M_impl.super__Rb_tree_header,
                       pbVar9,(_Alloc_node *)&local_a8);
            _Var5._M_p = local_a8._M_dataplus._M_p;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_88);
        }
        local_60 = local_60 + 1;
      } while (local_60 !=
               (local_50->super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>).
               _M_impl.super__Vector_impl_data._M_finish);
    }
  }
  return &local_68->super_CompatibleInterfaces;
}

Assistant:

cmTarget::CompatibleInterfaces const&
cmTarget::GetCompatibleInterfaces(std::string const& config) const
{
  cmTargetInternals::CompatibleInterfaces& compat =
    this->Internal->CompatibleInterfacesMap[config];
  if(!compat.Done)
    {
    compat.Done = true;
    compat.PropsBool.insert("POSITION_INDEPENDENT_CODE");
    compat.PropsString.insert("AUTOUIC_OPTIONS");
    std::vector<cmTarget const*> const& deps =
      this->GetLinkImplementationClosure(config);
    for(std::vector<cmTarget const*>::const_iterator li = deps.begin();
        li != deps.end(); ++li)
      {
#define CM_READ_COMPATIBLE_INTERFACE(X, x) \
      if(const char* prop = (*li)->GetProperty("COMPATIBLE_INTERFACE_" #X)) \
        { \
        std::vector<std::string> props; \
        cmSystemTools::ExpandListArgument(prop, props); \
        compat.Props##x.insert(props.begin(), props.end()); \
        }
      CM_READ_COMPATIBLE_INTERFACE(BOOL, Bool)
      CM_READ_COMPATIBLE_INTERFACE(STRING, String)
      CM_READ_COMPATIBLE_INTERFACE(NUMBER_MIN, NumberMin)
      CM_READ_COMPATIBLE_INTERFACE(NUMBER_MAX, NumberMax)
#undef CM_READ_COMPATIBLE_INTERFACE
      }
    }
  return compat;
}